

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O2

_Bool fs_stdio_make_directory(char *tail)

{
  _Bool _Var1;
  WRAP_CHAR *__s;
  size_t sVar2;
  WRAP_CHAR *pWVar3;
  
  __s = make_absolute_path(tail);
  if (__s == (WRAP_CHAR *)0x0) {
    _Var1 = false;
  }
  else {
    sVar2 = strlen(__s);
    pWVar3 = __s;
    do {
      do {
        pWVar3 = pWVar3 + 1;
        if (__s + sVar2 <= pWVar3) {
          _Var1 = mkdir_exists(__s);
          goto LAB_0015a459;
        }
      } while (*pWVar3 != '/');
      *pWVar3 = '\0';
      _Var1 = mkdir_exists(__s);
      *pWVar3 = '/';
    } while (_Var1);
    _Var1 = false;
LAB_0015a459:
    free(__s);
  }
  return _Var1;
}

Assistant:

static bool fs_stdio_make_directory(const char *tail)
{
   bool ret = false;
   WRAP_CHAR *abs_path = make_absolute_path(tail);
   if (abs_path) {
      ret = do_make_directory(abs_path);
      free(abs_path);
   }
   return ret;
}